

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

size_t mbsnbytes(void *_p,size_t n)

{
  size_t sVar1;
  size_t s;
  size_t sVar2;
  char *pp;
  
  for (sVar2 = 0; (sVar1 = n, n != sVar2 && (sVar1 = sVar2, *(char *)((long)_p + sVar2) != '\0'));
      sVar2 = sVar2 + 1) {
  }
  return sVar1;
}

Assistant:

static size_t
mbsnbytes(const void *_p, size_t n)
{
	size_t s;
	const char *p, *pp;

	if (_p == NULL)
		return (0);
	p = (const char *)_p;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	return (s);
}